

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

bool __thiscall QTextEditControl::canInsertFromMimeData(QTextEditControl *this,QMimeData *source)

{
  byte bVar1;
  QTextEdit *pQVar2;
  undefined8 in_RSI;
  QTextEdit *ed;
  QMimeData *in_stack_00000028;
  QWidgetTextControl *in_stack_00000030;
  bool local_1;
  
  QObject::parent((QObject *)0x6d9500);
  pQVar2 = qobject_cast<QTextEdit*>((QObject *)0x6d9508);
  if (pQVar2 == (QTextEdit *)0x0) {
    local_1 = QWidgetTextControl::canInsertFromMimeData(in_stack_00000030,in_stack_00000028);
  }
  else {
    bVar1 = (**(code **)(*(long *)&(pQVar2->super_QAbstractScrollArea).super_QFrame.super_QWidget +
                        0x1d8))(pQVar2,in_RSI);
    local_1 = (bool)(bVar1 & 1);
  }
  return local_1;
}

Assistant:

virtual bool canInsertFromMimeData(const QMimeData *source) const override {
        QTextEdit *ed = qobject_cast<QTextEdit *>(parent());
        if (!ed)
            return QWidgetTextControl::canInsertFromMimeData(source);
        return ed->canInsertFromMimeData(source);
    }